

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CodedOutputStream::WriteLittleEndian64(CodedOutputStream *this,uint64 value)

{
  uint64 *puVar1;
  bool bVar2;
  uint8 bytes [8];
  
  puVar1 = (uint64 *)bytes;
  bVar2 = (uint)this->buffer_size_ < 8;
  if (!bVar2) {
    puVar1 = (uint64 *)this->buffer_;
  }
  *puVar1 = value;
  if (bVar2) {
    WriteRaw(this,bytes,8);
  }
  else {
    this->buffer_ = this->buffer_ + 8;
    this->buffer_size_ = this->buffer_size_ + -8;
  }
  return;
}

Assistant:

void CodedOutputStream::WriteLittleEndian64(uint64 value) {
  uint8 bytes[sizeof(value)];

  bool use_fast = buffer_size_ >= sizeof(value);
  uint8* ptr = use_fast ? buffer_ : bytes;

  WriteLittleEndian64ToArray(value, ptr);

  if (use_fast) {
    Advance(sizeof(value));
  } else {
    WriteRaw(bytes, sizeof(value));
  }
}